

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void closeCursorsInFrame(Vdbe *p)

{
  long lVar1;
  
  if (0 < p->nCursor) {
    lVar1 = 0;
    do {
      if (p->apCsr[lVar1] != (VdbeCursor *)0x0) {
        sqlite3VdbeFreeCursorNN(p,p->apCsr[lVar1]);
        p->apCsr[lVar1] = (VdbeCursor *)0x0;
      }
      lVar1 = lVar1 + 1;
    } while (lVar1 < p->nCursor);
  }
  return;
}

Assistant:

static void closeCursorsInFrame(Vdbe *p){
  int i;
  for(i=0; i<p->nCursor; i++){
    VdbeCursor *pC = p->apCsr[i];
    if( pC ){
      sqlite3VdbeFreeCursorNN(p, pC);
      p->apCsr[i] = 0;
    }
  }
}